

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int khttp_connect_file(knetFile *fp)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  off_t oVar4;
  int *piVar5;
  off_t local_48;
  off_t l_1;
  off_t rest;
  char *p;
  char *buf;
  int l;
  int ret;
  knetFile *fp_local;
  
  buf._0_4_ = 0;
  _l = fp;
  if (fp->fd != -1) {
    close(fp->fd);
  }
  iVar1 = socket_connect(_l->host,_l->port);
  _l->fd = iVar1;
  p = (char *)calloc(0x10000,1);
  iVar1 = sprintf(p + (int)buf,"GET %s HTTP/1.0\r\nHost: %s\r\n",_l->path,_l->http_host);
  buf._0_4_ = iVar1 + (int)buf;
  iVar1 = sprintf(p + (int)buf,"Range: bytes=%lld-\r\n",_l->offset);
  buf._0_4_ = iVar1 + (int)buf;
  iVar1 = sprintf(p + (int)buf,"\r\n");
  buf._0_4_ = iVar1 + (int)buf;
  sVar2 = write(_l->fd,p,(long)(int)buf);
  if (sVar2 == (int)buf) {
    buf._0_4_ = 0;
    while ((sVar2 = read(_l->fd,p + (int)buf,1), sVar2 != 0 &&
           (((p[(int)buf] != '\n' || ((int)buf < 3)) ||
            (iVar1 = strncmp(p + (long)(int)buf + -3,"\r\n\r\n",4), iVar1 != 0))))) {
      buf._0_4_ = (int)buf + 1;
    }
    p[(int)buf] = '\0';
    if ((int)buf < 0xe) {
      free(p);
      close(_l->fd);
      _l->fd = -1;
      fp_local._4_4_ = -1;
    }
    else {
      lVar3 = strtol(p + 8,(char **)&rest,0);
      buf._4_4_ = (int)lVar3;
      if ((buf._4_4_ == 200) && (0 < _l->offset)) {
        for (l_1 = _l->offset; l_1 != 0; l_1 = l_1 - oVar4) {
          if (l_1 < 0x10000) {
            local_48 = l_1;
          }
          else {
            local_48 = 0x10000;
          }
          oVar4 = my_netread(_l->fd,p,local_48);
        }
      }
      else if ((buf._4_4_ != 0xce) && (buf._4_4_ != 200)) {
        free(p);
        close(_l->fd);
        if (buf._4_4_ == 0x191) {
          piVar5 = __errno_location();
          *piVar5 = 1;
        }
        else if (buf._4_4_ == 0x193) {
          piVar5 = __errno_location();
          *piVar5 = 0xd;
        }
        else if (buf._4_4_ == 0x194) {
          piVar5 = __errno_location();
          *piVar5 = 2;
        }
        else if (buf._4_4_ == 0x197) {
          piVar5 = __errno_location();
          *piVar5 = 1;
        }
        else if (buf._4_4_ == 0x198) {
          piVar5 = __errno_location();
          *piVar5 = 0x6e;
        }
        else if (buf._4_4_ == 0x19a) {
          piVar5 = __errno_location();
          *piVar5 = 2;
        }
        else if (buf._4_4_ == 0x1f7) {
          piVar5 = __errno_location();
          *piVar5 = 0xb;
        }
        else if (buf._4_4_ == 0x1f8) {
          piVar5 = __errno_location();
          *piVar5 = 0x6e;
        }
        else {
          iVar1 = 5;
          if (399 < buf._4_4_ && buf._4_4_ < 500) {
            iVar1 = 0x16;
          }
          piVar5 = __errno_location();
          *piVar5 = iVar1;
        }
        _l->fd = -1;
        return -1;
      }
      free(p);
      _l->is_ready = 1;
      fp_local._4_4_ = 0;
    }
  }
  else {
    free(p);
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int khttp_connect_file(knetFile *fp)
{
	int ret, l = 0;
	char *buf, *p;
	if (fp->fd != -1) netclose(fp->fd);
	fp->fd = socket_connect(fp->host, fp->port);
	buf = (char*)calloc(0x10000, 1); // FIXME: I am lazy... But in principle, 64KB should be large enough.
	l += sprintf(buf + l, "GET %s HTTP/1.0\r\nHost: %s\r\n", fp->path, fp->http_host);
    l += sprintf(buf + l, "Range: bytes=%lld-\r\n", (long long)fp->offset);
	l += sprintf(buf + l, "\r\n");
	if ( netwrite(fp->fd, buf, l) != l ) { free(buf); return -1; }
	l = 0;
	while (netread(fp->fd, buf + l, 1)) { // read HTTP header; FIXME: bad efficiency
		if (buf[l] == '\n' && l >= 3)
			if (strncmp(buf + l - 3, "\r\n\r\n", 4) == 0) break;
		++l;
	}
	buf[l] = 0;
	if (l < 14) { // prematured header
		free(buf);
		netclose(fp->fd);
		fp->fd = -1;
		return -1;
	}
	ret = strtol(buf + 8, &p, 0); // HTTP return code
	if (ret == 200 && fp->offset>0) { // 200 (complete result); then skip beginning of the file
		off_t rest = fp->offset;
		while (rest) {
			off_t l = rest < 0x10000? rest : 0x10000;
			rest -= my_netread(fp->fd, buf, l);
		}
	} else if (ret != 206 && ret != 200) {
		// failed to open file
		free(buf);
		netclose(fp->fd);
		switch (ret) {
		case 401: errno = EPERM; break;
		case 403: errno = EACCES; break;
		case 404: errno = ENOENT; break;
		case 407: errno = EPERM; break;
		case 408: errno = ETIMEDOUT; break;
		case 410: errno = ENOENT; break;
		case 503: errno = EAGAIN; break;
		case 504: errno = ETIMEDOUT; break;
		default:  errno = (ret >= 400 && ret < 500)? EINVAL : EIO; break;
		}
		fp->fd = -1;
		return -1;
	}
	free(buf);
	fp->is_ready = 1;
	return 0;
}